

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLut.cpp
# Opt level: O2

void testLut(string *param_1)

{
  float *pfVar1;
  uint __line;
  ushort uVar2;
  half hVar3;
  half hVar4;
  ostream *poVar5;
  void *pvVar6;
  half *phVar7;
  char *__function;
  long lVar8;
  int iVar9;
  char *__assertion;
  int iVar10;
  int y;
  long lVar11;
  int y_2;
  long lVar12;
  bool bVar13;
  float fVar14;
  Array2D<Imath_3_2::half> h;
  half h_2;
  int iStack_84;
  HalfLut lut;
  Slice s;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Testing lookup tables");
  std::endl<char,std::char_traits<char>>(poVar5);
  h._sizeX = 0x1f;
  h._sizeY = 0x43;
  h._data = (half *)operator_new__(0x103a);
  Imf_3_2::HalfLut::HalfLut<Imath_3_2::half(*)(Imath_3_2::half)>
            (&lut,anon_unknown.dwarf_184bf0::one);
  lVar8 = 0;
  for (lVar11 = 0; lVar11 != 0x1f; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar12 != 0x86; lVar12 = lVar12 + 2) {
      Imath_3_2::half::operator=((half *)((long)&(h._data)->_h + lVar12 + h._sizeY * lVar8),0.0);
    }
    lVar8 = lVar8 + 2;
  }
  Imf_3_2::HalfLut::apply((half *)&lut,(int)h._data,0x81d);
  lVar8 = 0;
  phVar7 = h._data;
  do {
    if (lVar8 == 0x1f) {
      lVar8 = 0;
      for (lVar11 = 0; lVar11 != 0x1f; lVar11 = lVar11 + 1) {
        for (lVar12 = 0; lVar12 != 0x86; lVar12 = lVar12 + 2) {
          Imath_3_2::half::operator=((half *)((long)&(h._data)->_h + lVar12 + h._sizeY * lVar8),0.0)
          ;
        }
        lVar8 = lVar8 + 2;
      }
      Imf_3_2::Slice::Slice(&s,HALF,(char *)h._data,2,0x86,1,1,0.0,false,false);
      _h_2 = 0x500000003;
      Imf_3_2::HalfLut::apply((Slice *)&lut,(Box *)&s);
      lVar8 = 0;
      phVar7 = h._data;
      do {
        if (lVar8 == 0x1f) {
          halfFunction<Imath_3_2::half>::~halfFunction(&lut._lut);
          Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&h);
          _s = (undefined1 *)0x1f;
          pvVar6 = operator_new__(0x40e8);
          Imf_3_2::RgbaLut::RgbaLut<Imath_3_2::half(*)(Imath_3_2::half)>
                    ((RgbaLut *)&h,anon_unknown.dwarf_184bf0::one,WRITE_RGB);
          lVar8 = 0;
          for (lVar11 = 0; lVar12 = 6, lVar11 != 0x1f; lVar11 = lVar11 + 1) {
            for (; lVar12 != 0x21e; lVar12 = lVar12 + 8) {
              Imath_3_2::half::operator=((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43 + -6),0.0);
              Imath_3_2::half::operator=((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43 + -4),0.0);
              Imath_3_2::half::operator=((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43 + -2),0.0);
              Imath_3_2::half::operator=((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43),0.0);
            }
            lVar8 = lVar8 + 8;
          }
          Imf_3_2::RgbaLut::apply((Rgba *)&h,(int)pvVar6,0x81d);
          lVar8 = (long)pvVar6 + 6;
          lVar11 = 0;
          do {
            if (lVar11 == 0x1f) {
              lVar8 = 0;
              for (lVar11 = 0; lVar12 = 6, lVar11 != 0x1f; lVar11 = lVar11 + 1) {
                for (; lVar12 != 0x21e; lVar12 = lVar12 + 8) {
                  Imath_3_2::half::operator=
                            ((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43 + -6),0.0);
                  Imath_3_2::half::operator=
                            ((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43 + -4),0.0);
                  Imath_3_2::half::operator=
                            ((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43 + -2),0.0);
                  Imath_3_2::half::operator=((half *)((long)pvVar6 + lVar12 + lVar8 * 0x43),0.0);
                }
                lVar8 = lVar8 + 8;
              }
              _h_2 = 0x500000003;
              Imf_3_2::RgbaLut::apply((Rgba *)&h,(int)pvVar6,1,(Box *)0x43);
              lVar8 = (long)pvVar6 + 6;
              lVar11 = 0;
              do {
                if (lVar11 == 0x1f) {
                  halfFunction<Imath_3_2::half>::~halfFunction((halfFunction<Imath_3_2::half> *)&h);
                  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&s);
                  _s = &DAT_5a5a5a5a;
                  iVar9 = 10000;
                  while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
                    fVar14 = Imath_3_2::Rand32::nextf((Rand32 *)&s,6.1035156e-05,65504.0);
                    Imath_3_2::half::half((half *)&h,fVar14);
                    uVar2 = Imf_3_2::round12log(h._sizeX._0_2_);
                    fVar14 = *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
                    hVar3._h = Imf_3_2::round12log(h._sizeX._0_2_);
                    uVar2 = Imf_3_2::round12log(hVar3);
                    pfVar1 = (float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
                    if ((fVar14 != *pfVar1) || (NAN(fVar14) || NAN(*pfVar1))) {
                      __assert_fail("round12log (h) == round12log (round12log (h))",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0xac,"void (anonymous namespace)::testRounding()");
                    }
                  }
                  for (iVar9 = 0; iVar9 != 0xb; iVar9 = iVar9 + 1) {
                    h._sizeX = CONCAT44(h._sizeX._4_4_,iVar9);
                    iVar10 = 10000;
                    while (bVar13 = iVar10 != 0, iVar10 = iVar10 + -1, bVar13) {
                      fVar14 = Imath_3_2::Rand32::nextf((Rand32 *)&s,6.1035156e-05,65504.0);
                      Imath_3_2::half::half(&h_2,fVar14);
                      hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,h_2);
                      fVar14 = *(float *)(_imath_half_to_float_table + (ulong)hVar4._h * 4);
                      hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,h_2);
                      hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,hVar4);
                      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)hVar4._h * 4);
                      if ((fVar14 != *pfVar1) || (NAN(fVar14) || NAN(*pfVar1))) {
                        __assert_fail("rn (h) == rn (rn (h))",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                      ,0xb6,"void (anonymous namespace)::testRounding()");
                      }
                    }
                  }
                  uVar2 = Imf_3_2::round12log((half)0xbc00);
                  fVar14 = *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
                  if ((fVar14 != 0.0) || (NAN(fVar14))) {
                    __assert_fail("round12log (-1) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                  ,0xbe,"void (anonymous namespace)::testRounding()");
                  }
                  uVar2 = Imf_3_2::round12log((half)0x0);
                  fVar14 = *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
                  if ((fVar14 != 0.0) || (NAN(fVar14))) {
                    __assert_fail("round12log (0) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                  ,0xbf,"void (anonymous namespace)::testRounding()");
                  }
                  uVar2 = Imf_3_2::round12log((half)0x3800);
                  fVar14 = *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
                  if ((fVar14 != 0.5) || (NAN(fVar14))) {
                    __assert_fail("round12log (0.5) == 0.5",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                  ,0xc0,"void (anonymous namespace)::testRounding()");
                  }
                  uVar2 = Imf_3_2::round12log((half)0x3c00);
                  fVar14 = *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
                  if ((fVar14 != 1.0) || (NAN(fVar14))) {
                    __assert_fail("round12log (1) == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                  ,0xc1,"void (anonymous namespace)::testRounding()");
                  }
                  uVar2 = Imf_3_2::round12log((half)0x4000);
                  fVar14 = *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
                  if ((fVar14 != 2.0) || (NAN(fVar14))) {
                    __assert_fail("round12log (2) == 2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                  ,0xc2,"void (anonymous namespace)::testRounding()");
                  }
                  h._sizeX = CONCAT44(h._sizeX._4_4_,3);
                  hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,(half)0xbc00);
                  fVar14 = *(float *)(_imath_half_to_float_table + (ulong)hVar4._h * 4);
                  if ((fVar14 == -1.0) && (!NAN(fVar14))) {
                    hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,(half)0x0);
                    fVar14 = *(float *)(_imath_half_to_float_table + (ulong)hVar4._h * 4);
                    if ((fVar14 != 0.0) || (NAN(fVar14))) {
                      __assert_fail("r3 (0) == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,199,"void (anonymous namespace)::testRounding()");
                    }
                    hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,(half)0x3800);
                    fVar14 = *(float *)(_imath_half_to_float_table + (ulong)hVar4._h * 4);
                    if ((fVar14 == 0.5) && (!NAN(fVar14))) {
                      hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,(half)0x3c00);
                      fVar14 = *(float *)(_imath_half_to_float_table + (ulong)hVar4._h * 4);
                      if ((fVar14 == 1.0) && (!NAN(fVar14))) {
                        hVar4 = Imf_3_2::roundNBit::operator()((roundNBit *)&h,(half)0x4000);
                        fVar14 = *(float *)(_imath_half_to_float_table + (ulong)hVar4._h * 4);
                        if ((fVar14 == 2.0) && (!NAN(fVar14))) {
                          poVar5 = std::operator<<((ostream *)&std::cout,"ok\n");
                          std::endl<char,std::char_traits<char>>(poVar5);
                          return;
                        }
                        __assert_fail("r3 (2) == 2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                      ,0xca,"void (anonymous namespace)::testRounding()");
                      }
                      __assert_fail("r3 (1) == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0xc9,"void (anonymous namespace)::testRounding()");
                    }
                    __assert_fail("r3 (0.5) == 0.5",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                  ,200,"void (anonymous namespace)::testRounding()");
                  }
                  __assert_fail("r3 (-1) == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                ,0xc6,"void (anonymous namespace)::testRounding()");
                }
                for (lVar12 = 0; lVar12 != 0x43; lVar12 = lVar12 + 1) {
                  fVar14 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar8 + -6 + lVar12 * 8) * 4);
                  if ((((lVar12 < _h_2) || (0x2d < lVar12)) || (lVar11 < iStack_84)) ||
                     (0x1b < lVar11)) {
                    if ((fVar14 != 0.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].r == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x96,"void (anonymous namespace)::testRgbaLut()");
                    }
                    fVar14 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(lVar8 + -4 + lVar12 * 8) * 4);
                    if ((fVar14 != 0.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].g == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x97,"void (anonymous namespace)::testRgbaLut()");
                    }
                    fVar14 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(lVar8 + -2 + lVar12 * 8) * 4);
                    if ((fVar14 != 0.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].b == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x98,"void (anonymous namespace)::testRgbaLut()");
                    }
                    fVar14 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(lVar8 + lVar12 * 8) * 4);
                    if ((fVar14 != 0.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].a == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x99,"void (anonymous namespace)::testRgbaLut()");
                    }
                  }
                  else {
                    if ((fVar14 != 1.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].r == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x8f,"void (anonymous namespace)::testRgbaLut()");
                    }
                    fVar14 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(lVar8 + -4 + lVar12 * 8) * 4);
                    if ((fVar14 != 1.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].g == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x90,"void (anonymous namespace)::testRgbaLut()");
                    }
                    fVar14 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(lVar8 + -2 + lVar12 * 8) * 4);
                    if ((fVar14 != 1.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].b == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x91,"void (anonymous namespace)::testRgbaLut()");
                    }
                    fVar14 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(lVar8 + lVar12 * 8) * 4);
                    if ((fVar14 != 0.0) || (NAN(fVar14))) {
                      __assert_fail("rgba[y][x].a == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                                    ,0x92,"void (anonymous namespace)::testRgbaLut()");
                    }
                  }
                }
                lVar11 = lVar11 + 1;
                lVar8 = lVar8 + 0x218;
              } while( true );
            }
            lVar12 = 0;
            while (lVar12 != 0x43) {
              fVar14 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar8 + -6 + lVar12 * 8) * 4);
              if ((fVar14 != 1.0) || (NAN(fVar14))) {
                __assertion = "rgba[y][x].r == 1";
                __function = "void (anonymous namespace)::testRgbaLut()";
                __line = 0x6f;
                goto LAB_00166771;
              }
              fVar14 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar8 + -4 + lVar12 * 8) * 4);
              if ((fVar14 != 1.0) || (NAN(fVar14))) {
                __assertion = "rgba[y][x].g == 1";
                __function = "void (anonymous namespace)::testRgbaLut()";
                __line = 0x70;
                goto LAB_00166771;
              }
              fVar14 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar8 + -2 + lVar12 * 8) * 4);
              if ((fVar14 != 1.0) || (NAN(fVar14))) {
                __assertion = "rgba[y][x].b == 1";
                __function = "void (anonymous namespace)::testRgbaLut()";
                __line = 0x71;
                goto LAB_00166771;
              }
              fVar14 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar8 + lVar12 * 8) * 4);
              lVar12 = lVar12 + 1;
              if ((fVar14 != 0.0) || (NAN(fVar14))) {
                __assertion = "rgba[y][x].a == 0";
                __function = "void (anonymous namespace)::testRgbaLut()";
                __line = 0x72;
                goto LAB_00166771;
              }
            }
            lVar11 = lVar11 + 1;
            lVar8 = lVar8 + 0x218;
          } while( true );
        }
        for (lVar11 = 0; lVar11 != 0x43; lVar11 = lVar11 + 1) {
          fVar14 = *(float *)(_imath_half_to_float_table + (ulong)phVar7[lVar11]._h * 4);
          if ((((lVar11 < _h_2) || (0x2d < lVar11)) || (lVar8 < iStack_84)) || (0x1b < lVar8)) {
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              __assertion = "h[y][x] == 0";
              __function = "void (anonymous namespace)::testHalfLut()";
              __line = 0x4e;
              goto LAB_00166771;
            }
          }
          else if ((fVar14 != 1.0) || (NAN(fVar14))) {
            __assertion = "h[y][x] == 1";
            __function = "void (anonymous namespace)::testHalfLut()";
            __line = 0x4c;
            goto LAB_00166771;
          }
        }
        lVar8 = lVar8 + 1;
        phVar7 = phVar7 + h._sizeY;
      } while( true );
    }
    lVar11 = 0;
    while (lVar11 != 0x43) {
      fVar14 = *(float *)(_imath_half_to_float_table + (ulong)phVar7[lVar11]._h * 4);
      lVar11 = lVar11 + 1;
      if ((fVar14 != 1.0) || (NAN(fVar14))) {
        __assertion = "h[y][x] == 1";
        __function = "void (anonymous namespace)::testHalfLut()";
        __line = 0x33;
LAB_00166771:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLut.cpp"
                      ,__line,__function);
      }
    }
    lVar8 = lVar8 + 1;
    phVar7 = phVar7 + h._sizeY;
  } while( true );
}

Assistant:

void
testLut (const std::string&)
{
    try
    {
        cout << "Testing lookup tables" << endl;

        testHalfLut ();
        testRgbaLut ();
        testRounding ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}